

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::train(FastText *this,Args *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  Model *this_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  char cVar7;
  int iVar8;
  int32_t iVar9;
  invalid_argument *piVar10;
  int local_46c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_441;
  ulong local_440;
  ifstream ifs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_430 [65];
  ifstream wfs;
  
  _ifs = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Args,std::allocator<fasttext::Args>,fasttext::Args_const&>
            (a_Stack_430,(Args **)&ifs,(allocator<fasttext::Args> *)&wfs,args);
  _Var6._M_pi = a_Stack_430[0]._M_pi;
  peVar2 = _ifs;
  _ifs = (element_type *)0x0;
  a_Stack_430[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     a_Stack_430[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_430[0]._M_pi);
  }
  _ifs = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Dictionary,std::allocator<fasttext::Dictionary>,std::shared_ptr<fasttext::Args>&>
            (a_Stack_430,(Dictionary **)&ifs,(allocator<fasttext::Dictionary> *)&wfs,&this->args_);
  _Var6._M_pi = a_Stack_430[0]._M_pi;
  peVar5 = (element_type *)_ifs;
  _ifs = (element_type *)0x0;
  a_Stack_430[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5
  ;
  (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     a_Stack_430[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_430[0]._M_pi);
  }
  iVar8 = std::__cxx11::string::compare
                    ((char *)(this->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar8 == 0) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"Cannot use stdin for training!");
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ifstream::ifstream
            (&ifs,(string *)
                  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,_S_in);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wfs,
                   &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->input," cannot be opened for training!");
    std::invalid_argument::invalid_argument(piVar10,(string *)&wfs);
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  Dictionary::readFromFile
            ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(istream *)&ifs);
  std::ifstream::close();
  std::ifstream::ifstream
            (&wfs,(string *)
                  &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->weights,_S_in);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_468,
                   &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->weights," cannot be opened for weights!");
    std::invalid_argument::invalid_argument(piVar10,(string *)&local_468);
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_440 = Dictionary::nids((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  local_46c = 1;
  local_468._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,long,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_468._M_string_length,
             (Matrix **)&local_468,(allocator<fasttext::Matrix> *)&local_441,(long *)&local_440,
             &local_46c);
  sVar4 = local_468._M_string_length;
  _Var3._M_p = local_468._M_dataplus._M_p;
  local_468._M_dataplus._M_p = (pointer)0x0;
  local_468._M_string_length = 0;
  p_Var1 = (this->weights_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->weights_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var3._M_p;
  (this->weights_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._M_string_length !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._M_string_length);
  }
  Matrix::load((this->weights_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(istream *)&wfs);
  std::ifstream::close();
  peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2->pretrainedVectors)._M_string_length == 0) {
    iVar9 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_468._M_dataplus._M_p = (pointer)0x0;
    local_440 = CONCAT44(local_440._4_4_,iVar9 + peVar2->bucket);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_468._M_string_length,
               (Matrix **)&local_468,(allocator<fasttext::Matrix> *)&local_46c,(int *)&local_440,
               &peVar2->dim);
    sVar4 = local_468._M_string_length;
    _Var3._M_p = local_468._M_dataplus._M_p;
    local_468._M_dataplus._M_p = (pointer)0x0;
    local_468._M_string_length = 0;
    p_Var1 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var3._M_p;
    (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._M_string_length);
    }
    Matrix::uniform((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,1.0 / (float)((this->args_).
                                         super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->dim);
  }
  else {
    loadVectors(this,&peVar2->pretrainedVectors);
  }
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    iVar9 = Dictionary::nlabels((this->dict_).
                                super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
    local_440 = CONCAT44(local_440._4_4_,iVar9);
    local_468._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_468._M_string_length,
               (Matrix **)&local_468,(allocator<fasttext::Matrix> *)&local_46c,(int *)&local_440,
               &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->dim);
    sVar4 = local_468._M_string_length;
    _Var3._M_p = local_468._M_dataplus._M_p;
    local_468._M_dataplus._M_p = (pointer)0x0;
    local_468._M_string_length = 0;
    p_Var1 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var3._M_p;
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
    if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00121825;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  else {
    iVar9 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    local_440 = CONCAT44(local_440._4_4_,iVar9);
    local_468._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_468._M_string_length,
               (Matrix **)&local_468,(allocator<fasttext::Matrix> *)&local_46c,(int *)&local_440,
               &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->dim);
    sVar4 = local_468._M_string_length;
    _Var3._M_p = local_468._M_dataplus._M_p;
    local_468._M_dataplus._M_p = (pointer)0x0;
    local_468._M_string_length = 0;
    p_Var1 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var3._M_p;
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
    if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00121825;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._M_string_length);
  }
LAB_00121825:
  Matrix::zero((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  startThreads(this);
  local_440 = local_440 & 0xffffffff00000000;
  local_468._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Model,std::allocator<fasttext::Model>,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_468._M_string_length,
             (Model **)&local_468,(allocator<fasttext::Model> *)&local_46c,&this->input_,
             &this->output_,&this->weights_,&this->args_,(int *)&local_440);
  sVar4 = local_468._M_string_length;
  _Var3._M_p = local_468._M_dataplus._M_p;
  local_468._M_dataplus._M_p = (pointer)0x0;
  local_468._M_string_length = 0;
  p_Var1 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var3._M_p;
  (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._M_string_length !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._M_string_length);
  }
  this_00 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&local_468,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,label);
    Model::setTargetCounts(this_00,(vector<long,_std::allocator<long>_> *)&local_468);
  }
  else {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&local_468,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,word);
    Model::setTargetCounts(this_00,(vector<long,_std::allocator<long>_> *)&local_468);
  }
  if (local_468._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(&wfs);
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

void FastText::train(const Args& args) {
	args_ = std::make_shared<Args>(args);
	dict_ = std::make_shared<Dictionary>(args_);
	if (args_->input == "-") {
		// manage expectations
		throw std::invalid_argument("Cannot use stdin for training!");
	}
	std::ifstream ifs(args_->input);
	if (!ifs.is_open()) {
		throw std::invalid_argument(
				args_->input + " cannot be opened for training!");
	}
	dict_->readFromFile(ifs);
	ifs.close();
	std::ifstream wfs(args_->weights);
	if (!wfs.is_open()) {
		throw std::invalid_argument(
				args_->weights + " cannot be opened for weights!");
	}
	weights_ = std::make_shared<Matrix>(dict_->nids(),1);
	weights_->load(wfs);
	wfs.close();
	// weights_->load(0);
	if (args_->pretrainedVectors.size() != 0) {
		loadVectors(args_->pretrainedVectors);
		// std::cerr << "Number of words:  " << dict_->nwords() << std::endl;
	} else {
		input_ =
				std::make_shared<Matrix>(dict_->nwords() + args_->bucket, args_->dim);
		input_->uniform(1.0 / args_->dim);
	}

	if (args_->model == model_name::sup) {
		output_ = std::make_shared<Matrix>(dict_->nlabels(), args_->dim);
	} else {
		output_ = std::make_shared<Matrix>(dict_->nwords(), args_->dim);
	}
	output_->zero();
	startThreads();
	model_ = std::make_shared<Model>(input_, output_, weights_, args_, 0);
	if (args_->model == model_name::sup) {
		model_->setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model_->setTargetCounts(dict_->getCounts(entry_type::word));
	}
}